

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

env * __thiscall lest::env::sections_abi_cxx11_(env *this)

{
  size_type sVar1;
  size_type sVar2;
  long in_RSI;
  string local_98 [32];
  size_type local_78;
  size_t i;
  text msg;
  allocator local_39;
  string local_38 [40];
  env *this_local;
  
  this_local = this;
  if ((*(byte *)(in_RSI + 0x12) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"",&local_39);
    std::__cxx11::string::string((string *)this,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    std::__cxx11::string::string((string *)&i);
    local_78 = 0;
    while( true ) {
      sVar1 = local_78;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RSI + 0x40));
      if (sVar1 == sVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 0x40),local_78);
      std::operator+((char *)local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\n  ");
      std::__cxx11::string::operator+=((string *)&i,local_98);
      std::__cxx11::string::~string(local_98);
      local_78 = local_78 + 1;
    }
    std::__cxx11::string::string((string *)this,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
  }
  return this;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( size_t i = 0; i != ctx.size(); ++i )
        {
            msg += "\n  " + ctx[i];
        }
        return msg;
    }